

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

char * md5_print(uchar *md5,char *out)

{
  int local_1c;
  int i;
  char *out_local;
  uchar *md5_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    out[local_1c << 1] = "0123456789abcdef"[(int)(uint)md5[local_1c] >> 4];
    out[local_1c * 2 + 1] = "0123456789abcdef"[(int)(md5[local_1c] & 0xf)];
  }
  out[0x20] = '\0';
  return out;
}

Assistant:

static char *md5_print(unsigned char *md5, char *out) {
    int i;
    for (i = 0; i < 16; i++) {
	out[i*2+0] = "0123456789abcdef"[md5[i]>>4];
	out[i*2+1] = "0123456789abcdef"[md5[i]&15];
    }
    out[32] = 0;

    return out;
}